

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O0

int ZXing::QRCode::CalculateBCHCode(int value,int poly)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  int in_EDI;
  int msbSetInPoly;
  undefined4 local_4;
  
  iVar1 = FindMSBSet(0);
  local_4 = in_EDI << ((char)iVar1 - 1U & 0x1f);
  while( true ) {
    iVar2 = FindMSBSet(0);
    if (iVar2 < iVar1) break;
    iVar2 = FindMSBSet(0);
    local_4 = in_ESI << ((char)iVar2 - (char)iVar1 & 0x1fU) ^ local_4;
  }
  return local_4;
}

Assistant:

static int CalculateBCHCode(int value, int poly)
{
	// If poly is "1 1111 0010 0101" (version info poly), msbSetInPoly is 13. We'll subtract 1
	// from 13 to make it 12.
	int msbSetInPoly = FindMSBSet(poly);
	value <<= msbSetInPoly - 1;
	// Do the division business using exclusive-or operations.
	while (FindMSBSet(value) >= msbSetInPoly) {
		value ^= poly << (FindMSBSet(value) - msbSetInPoly);
	}
	// Now the "value" is the remainder (i.e. the BCH code)
	return value;
}